

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

Sfm_Ntk_t *
Sfm_NtkConstruct(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed,Vec_Str_t *vEmpty,
                Vec_Wrd_t *vTruths)

{
  int iVar1;
  Sfm_Ntk_t *p;
  Vec_Int_t *pVVar2;
  Vec_Wec_t *pVVar3;
  
  Sfm_CheckConsistency(vFanins,nPis,nPos,vFixed);
  p = (Sfm_Ntk_t *)calloc(1,0x1c0);
  iVar1 = vFanins->nSize;
  p->nObjs = iVar1;
  p->nPis = nPis;
  p->nPos = nPos;
  p->nNodes = iVar1 - (nPos + nPis);
  p->vFixed = vFixed;
  p->vEmpty = vEmpty;
  p->vTruths = vTruths;
  iVar1 = vFanins->nSize;
  pVVar2 = vFanins->pArray;
  (p->vFanins).nCap = vFanins->nCap;
  (p->vFanins).nSize = iVar1;
  (p->vFanins).pArray = pVVar2;
  free(vFanins);
  Sfm_CreateFanout(&p->vFanins,&p->vFanouts);
  Sfm_CreateLevel(&p->vFanins,&p->vLevels,vEmpty);
  Sfm_CreateLevelR(&p->vFanouts,&p->vLevelsR,vEmpty);
  Vec_IntFill(&p->vCounts,p->nObjs,0);
  Vec_IntFill(&p->vTravIds,p->nObjs,0);
  Vec_IntFill(&p->vTravIds2,p->nObjs,0);
  Vec_IntFill(&p->vId2Var,p->nObjs * 2,-1);
  Vec_IntFill(&p->vVar2Id,p->nObjs * 2,-1);
  pVVar2 = Vec_IntAlloc(0x10000);
  p->vCover = pVVar2;
  pVVar3 = Sfm_CreateCnf(p);
  p->vCnfs = pVVar3;
  return p;
}

Assistant:

Sfm_Ntk_t * Sfm_NtkConstruct( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed, Vec_Str_t * vEmpty, Vec_Wrd_t * vTruths )
{
    Sfm_Ntk_t * p;
    Sfm_CheckConsistency( vFanins, nPis, nPos, vFixed );
    p = ABC_CALLOC( Sfm_Ntk_t, 1 );
    p->nObjs    = Vec_WecSize( vFanins );
    p->nPis     = nPis;
    p->nPos     = nPos;
    p->nNodes   = p->nObjs - p->nPis - p->nPos;
    // user data
    p->vFixed   = vFixed;
    p->vEmpty   = vEmpty;
    p->vTruths  = vTruths;
    p->vFanins  = *vFanins;
    ABC_FREE( vFanins );
    // attributes
    Sfm_CreateFanout( &p->vFanins, &p->vFanouts );
    Sfm_CreateLevel( &p->vFanins, &p->vLevels, vEmpty );
    Sfm_CreateLevelR( &p->vFanouts, &p->vLevelsR, vEmpty );
    Vec_IntFill( &p->vCounts,   p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds,  p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds2, p->nObjs,  0 );
    Vec_IntFill( &p->vId2Var,   2*p->nObjs, -1 );
    Vec_IntFill( &p->vVar2Id,   2*p->nObjs, -1 );
    p->vCover   = Vec_IntAlloc( 1 << 16 );
    p->vCnfs    = Sfm_CreateCnf( p );
    return p;
}